

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetTargetPropertiesCommand.cxx
# Opt level: O2

bool cmSetTargetPropertiesCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  cmMakefile *this;
  bool bVar3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  cmTarget *this_00;
  string *prop;
  pointer pbVar5;
  allocator<char> local_61;
  string local_60;
  cmExecutionStatus *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  pbVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar1 - (long)pbVar5) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"called with incorrect number of arguments",&local_61);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[11]>>
                      (pbVar5,pbVar1,"PROPERTIES");
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((_Var4._M_current == pbVar2) || (local_38 = _Var4._M_current + 1, local_38 == pbVar2)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,
                 "called with illegal arguments, maybe missing a PROPERTIES specifier?",&local_61);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else if (((long)pbVar2 - (long)_Var4._M_current >> 5 & 0x8000000000000001U) == 1) {
      this = status->Makefile;
      pbVar5 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_40 = status;
      while( true ) {
        if (pbVar5 == _Var4._M_current) {
          return true;
        }
        bVar3 = cmMakefile::IsAlias(this,pbVar5);
        if (bVar3) break;
        this_00 = cmMakefile::FindTargetToUse(this,pbVar5,false);
        prop = local_38;
        if (this_00 == (cmTarget *)0x0) {
          cmStrCat<char_const(&)[43],std::__cxx11::string_const&>
                    (&local_60,(char (*) [43])"Can not find target to add properties to: ",pbVar5);
          std::__cxx11::string::_M_assign((string *)&local_40->Error);
          goto LAB_003f125b;
        }
        for (; prop != (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish; prop = prop + 2) {
          cmTarget::SetProperty(this_00,prop,prop + 1);
          cmTarget::CheckProperty(this_00,prop,this);
        }
        pbVar5 = pbVar5 + 1;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"can not be used on an ALIAS target.",&local_61);
      std::__cxx11::string::_M_assign((string *)&local_40->Error);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"called with incorrect number of arguments.",&local_61);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
  }
LAB_003f125b:
  std::__cxx11::string::~string((string *)&local_60);
  return false;
}

Assistant:

bool cmSetTargetPropertiesCommand(std::vector<std::string> const& args,
                                  cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  // first identify the properties arguments
  auto propsIter = std::find(args.begin(), args.end(), "PROPERTIES");
  if (propsIter == args.end() || propsIter + 1 == args.end()) {
    status.SetError("called with illegal arguments, maybe missing a "
                    "PROPERTIES specifier?");
    return false;
  }

  if (std::distance(propsIter, args.end()) % 2 != 1) {
    status.SetError("called with incorrect number of arguments.");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();

  // loop over all the targets
  for (const std::string& tname : cmStringRange{ args.begin(), propsIter }) {
    if (mf.IsAlias(tname)) {
      status.SetError("can not be used on an ALIAS target.");
      return false;
    }
    if (cmTarget* target = mf.FindTargetToUse(tname)) {
      // loop through all the props and set them
      for (auto k = propsIter + 1; k != args.end(); k += 2) {
        target->SetProperty(*k, *(k + 1));
        target->CheckProperty(*k, &mf);
      }
    } else {
      status.SetError(
        cmStrCat("Can not find target to add properties to: ", tname));
      return false;
    }
  }
  return true;
}